

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

void load_GL_ATI_fragment_shader(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ATI_fragment_shader != 0) {
    glad_glGenFragmentShadersATI =
         (PFNGLGENFRAGMENTSHADERSATIPROC)(*load)("glGenFragmentShadersATI");
    glad_glBindFragmentShaderATI =
         (PFNGLBINDFRAGMENTSHADERATIPROC)(*load)("glBindFragmentShaderATI");
    glad_glDeleteFragmentShaderATI =
         (PFNGLDELETEFRAGMENTSHADERATIPROC)(*load)("glDeleteFragmentShaderATI");
    glad_glBeginFragmentShaderATI =
         (PFNGLBEGINFRAGMENTSHADERATIPROC)(*load)("glBeginFragmentShaderATI");
    glad_glEndFragmentShaderATI = (PFNGLENDFRAGMENTSHADERATIPROC)(*load)("glEndFragmentShaderATI");
    glad_glPassTexCoordATI = (PFNGLPASSTEXCOORDATIPROC)(*load)("glPassTexCoordATI");
    glad_glSampleMapATI = (PFNGLSAMPLEMAPATIPROC)(*load)("glSampleMapATI");
    glad_glColorFragmentOp1ATI = (PFNGLCOLORFRAGMENTOP1ATIPROC)(*load)("glColorFragmentOp1ATI");
    glad_glColorFragmentOp2ATI = (PFNGLCOLORFRAGMENTOP2ATIPROC)(*load)("glColorFragmentOp2ATI");
    glad_glColorFragmentOp3ATI = (PFNGLCOLORFRAGMENTOP3ATIPROC)(*load)("glColorFragmentOp3ATI");
    glad_glAlphaFragmentOp1ATI = (PFNGLALPHAFRAGMENTOP1ATIPROC)(*load)("glAlphaFragmentOp1ATI");
    glad_glAlphaFragmentOp2ATI = (PFNGLALPHAFRAGMENTOP2ATIPROC)(*load)("glAlphaFragmentOp2ATI");
    glad_glAlphaFragmentOp3ATI = (PFNGLALPHAFRAGMENTOP3ATIPROC)(*load)("glAlphaFragmentOp3ATI");
    glad_glSetFragmentShaderConstantATI =
         (PFNGLSETFRAGMENTSHADERCONSTANTATIPROC)(*load)("glSetFragmentShaderConstantATI");
  }
  return;
}

Assistant:

static void load_GL_ATI_fragment_shader(GLADloadproc load) {
	if(!GLAD_GL_ATI_fragment_shader) return;
	glad_glGenFragmentShadersATI = (PFNGLGENFRAGMENTSHADERSATIPROC)load("glGenFragmentShadersATI");
	glad_glBindFragmentShaderATI = (PFNGLBINDFRAGMENTSHADERATIPROC)load("glBindFragmentShaderATI");
	glad_glDeleteFragmentShaderATI = (PFNGLDELETEFRAGMENTSHADERATIPROC)load("glDeleteFragmentShaderATI");
	glad_glBeginFragmentShaderATI = (PFNGLBEGINFRAGMENTSHADERATIPROC)load("glBeginFragmentShaderATI");
	glad_glEndFragmentShaderATI = (PFNGLENDFRAGMENTSHADERATIPROC)load("glEndFragmentShaderATI");
	glad_glPassTexCoordATI = (PFNGLPASSTEXCOORDATIPROC)load("glPassTexCoordATI");
	glad_glSampleMapATI = (PFNGLSAMPLEMAPATIPROC)load("glSampleMapATI");
	glad_glColorFragmentOp1ATI = (PFNGLCOLORFRAGMENTOP1ATIPROC)load("glColorFragmentOp1ATI");
	glad_glColorFragmentOp2ATI = (PFNGLCOLORFRAGMENTOP2ATIPROC)load("glColorFragmentOp2ATI");
	glad_glColorFragmentOp3ATI = (PFNGLCOLORFRAGMENTOP3ATIPROC)load("glColorFragmentOp3ATI");
	glad_glAlphaFragmentOp1ATI = (PFNGLALPHAFRAGMENTOP1ATIPROC)load("glAlphaFragmentOp1ATI");
	glad_glAlphaFragmentOp2ATI = (PFNGLALPHAFRAGMENTOP2ATIPROC)load("glAlphaFragmentOp2ATI");
	glad_glAlphaFragmentOp3ATI = (PFNGLALPHAFRAGMENTOP3ATIPROC)load("glAlphaFragmentOp3ATI");
	glad_glSetFragmentShaderConstantATI = (PFNGLSETFRAGMENTSHADERCONSTANTATIPROC)load("glSetFragmentShaderConstantATI");
}